

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

bool __thiscall MetaCommand::Parse(MetaCommand *this,int argc,char **argv)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  size_t sVar6;
  reference pvVar7;
  reference pvVar8;
  Option *pOVar9;
  reference pOVar10;
  ulong uVar11;
  size_type sVar12;
  reference pFVar13;
  undefined8 *in_RDX;
  uint in_ESI;
  long in_RDI;
  vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *this_00;
  double dVar14;
  double dVar15;
  bool in_stack_000000d7;
  MetaCommand *in_stack_000000d8;
  const_iterator itFields_1;
  bool valueInRange;
  iterator itParsed;
  bool defined;
  const_iterator itFields;
  bool requiredAndNotDefined;
  iterator it;
  unsigned_long s;
  bool found;
  long pos;
  iterator it_1;
  uint j;
  char optName [255];
  uint valuesInList;
  uint i;
  bool exportGAD;
  string completeString;
  bool isComplete;
  size_t valuesRemaining;
  long currentOption;
  long currentField;
  string tag;
  bool inArgument;
  size_t slash;
  vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  value_type *in_stack_fffffffffffff9d8;
  Option *in_stack_fffffffffffff9e0;
  MetaCommand *in_stack_fffffffffffff9e8;
  string *in_stack_fffffffffffffa20;
  MetaCommand *in_stack_fffffffffffffa28;
  MetaCommand *in_stack_fffffffffffffa30;
  MetaCommand *in_stack_fffffffffffffa38;
  MetaCommand *in_stack_fffffffffffffa90;
  MetaCommand *in_stack_fffffffffffffaa0;
  string *in_stack_fffffffffffffac8;
  undefined8 in_stack_fffffffffffffad0;
  string *in_stack_fffffffffffffad8;
  string *in_stack_fffffffffffffae0;
  MetaCommand *in_stack_fffffffffffffae8;
  string *in_stack_fffffffffffffb00;
  undefined8 in_stack_fffffffffffffb08;
  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  local_388;
  Option *local_380;
  byte local_371;
  __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
  local_370;
  Field *local_368;
  byte local_359;
  Field *local_358;
  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  local_350;
  Option *local_348;
  byte local_339;
  __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
  local_338;
  size_type local_330;
  Option *local_328;
  byte local_319;
  size_type local_318;
  __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
  local_310;
  allocator local_301;
  vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> local_300;
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  string local_290 [36];
  uint local_26c;
  char local_268 [268];
  uint local_15c;
  string local_158 [32];
  string local_138 [32];
  string local_118 [36];
  undefined4 local_f4;
  uint local_f0;
  byte local_ea;
  allocator local_e9;
  string local_e8 [39];
  byte local_c1;
  size_type local_c0;
  size_type local_b8;
  long local_b0;
  allocator local_91;
  string local_90 [39];
  byte local_69;
  string local_68 [32];
  string local_48 [32];
  long local_28;
  undefined8 *local_20;
  uint local_14;
  byte local_1;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  std::__cxx11::string::operator=((string *)(in_RDI + 0xa0),(char *)*in_RDX);
  local_28 = std::__cxx11::string::find_last_of((char *)(in_RDI + 0xa0),0x1d8c59);
  if (local_28 != 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_48,in_RDI + 0xa0);
    std::__cxx11::string::operator=((string *)(in_RDI + 0xa0),local_48);
    std::__cxx11::string::~string(local_48);
  }
  local_28 = std::__cxx11::string::find_last_of((char *)(in_RDI + 0xa0),0x1e6d5f);
  if (local_28 != 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_68,in_RDI + 0xa0);
    std::__cxx11::string::operator=((string *)(in_RDI + 0xa0),local_68);
    std::__cxx11::string::~string(local_68);
  }
  if (((local_14 == 2) && (iVar3 = strcmp((char *)local_20[1],"-V"), iVar3 == 0)) ||
     ((local_14 == 2 && (iVar3 = strcmp((char *)local_20[1],"-H"), iVar3 == 0)))) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Usage : ");
    poVar4 = std::operator<<(poVar4,(char *)*local_20);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    ListOptions(in_stack_fffffffffffffa90);
    local_1 = 0;
  }
  else if (((local_14 == 2) && (iVar3 = strcmp((char *)local_20[1],"-v"), iVar3 == 0)) ||
          ((local_14 == 2 && (iVar3 = strcmp((char *)local_20[1],"-h"), iVar3 == 0)))) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Usage : ");
    poVar4 = std::operator<<(poVar4,(char *)*local_20);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    ListOptionsSimplified(in_stack_fffffffffffffa30);
    local_1 = 0;
  }
  else if ((local_14 == 2) && (iVar3 = strcmp((char *)local_20[1],"-vxml"), iVar3 == 0)) {
    ListOptionsXML(in_stack_fffffffffffffaa0);
    local_1 = 0;
  }
  else if ((local_14 == 2) && (iVar3 = strcmp((char *)local_20[1],"-version"), iVar3 == 0)) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Version: ");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
  }
  else if ((local_14 == 2) && (iVar3 = strcmp((char *)local_20[1],"-date"), iVar3 == 0)) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Date: ");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
  }
  else if ((local_14 == 2) && (iVar3 = strcmp((char *)local_20[1],"-exportGAD"), iVar3 == 0)) {
    ExportGAD(in_stack_000000d8,in_stack_000000d7);
    local_1 = 0;
  }
  else {
    std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::clear
              ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)0x12b9e9);
    local_69 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"",&local_91);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    local_b0 = 0;
    local_b8 = 0;
    local_c0 = 0;
    local_c1 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"",&local_e9);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    local_ea = 0;
    for (local_f0 = 1; local_f0 < local_14; local_f0 = local_f0 + 1) {
      iVar3 = strcmp((char *)local_20[local_f0],"-exportGAD");
      if (iVar3 == 0) {
        local_ea = 1;
      }
      else {
        if (*(char *)local_20[local_f0] == '-') {
          dVar14 = atof((char *)local_20[local_f0]);
          if (((dVar14 != 0.0) || (NAN(dVar14))) ||
             (sVar6 = strlen((char *)local_20[local_f0]), sVar6 < 2)) goto LAB_0012c407;
          if (local_c0 != 0) {
            if ((local_c1 & 1) == 0) {
              poVar4 = std::operator<<((ostream *)&std::cout,"Found tag before end of value list!");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              local_1 = 0;
              goto LAB_0012d368;
            }
            pvVar7 = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::
                     operator[]((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *
                                )(in_RDI + 200),local_b8);
            pvVar8 = std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::
                     operator[](&pvVar7->fields,0);
            std::__cxx11::string::operator=((string *)&pvVar8->value,local_e8);
            this_00 = (vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                      (in_RDI + 200);
            pvVar7 = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::
                     operator[](this_00,local_b8);
            pvVar8 = std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::
                     operator[](&pvVar7->fields,0);
            pvVar8->userDefined = true;
            pvVar7 = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::
                     operator[](this_00,local_b8);
            pvVar7->userDefined = true;
            std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::operator[]
                      (this_00,local_b8);
            std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::push_back
                      ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                       in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
          }
          local_69 = 0;
          std::__cxx11::string::operator=(local_90,(char *)local_20[local_f0]);
          std::__cxx11::string::string(local_118,local_90);
          bVar2 = OptionExistsByMinusTag
                            (in_stack_fffffffffffffa38,&in_stack_fffffffffffffa30->m_Version);
          std::__cxx11::string::~string(local_118);
          if (bVar2) {
            local_69 = 1;
            std::__cxx11::string::string(local_138,local_90);
            pOVar9 = GetOptionByMinusTag(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
            local_c0 = std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::size
                                 (&pOVar9->fields);
            std::__cxx11::string::~string(local_138);
            std::__cxx11::string::string(local_158,local_90);
            GetOptionByMinusTag(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
            local_b8 = GetOptionId(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
            std::__cxx11::string::~string(local_158);
            if ((long)local_b8 < 0) {
              poVar4 = std::operator<<((ostream *)&std::cout,"Error processing tag ");
              pcVar5 = (char *)std::__cxx11::string::c_str();
              poVar4 = std::operator<<(poVar4,pcVar5);
              poVar4 = std::operator<<(poVar4,".  Tag exists but cannot find its Id.");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            }
            else {
              pvVar7 = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::
                       operator[]((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                                   *)(in_RDI + 200),local_b8);
              local_c1 = pvVar7->complete & 1;
              pvVar7 = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::
                       operator[]((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                                   *)(in_RDI + 200),local_b8);
              pvVar8 = std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::
                       operator[](&pvVar7->fields,0);
              if (pvVar8->type == FLAG) {
                pvVar7 = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::
                         operator[]((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                                     *)(in_RDI + 200),local_b8);
                pvVar8 = std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::
                         operator[](&pvVar7->fields,0);
                std::__cxx11::string::operator=((string *)&pvVar8->value,"true");
                local_c0 = 0;
                local_69 = 0;
              }
              else {
                pvVar7 = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::
                         operator[]((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                                     *)(in_RDI + 200),local_b8);
                pvVar8 = std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::
                         operator[](&pvVar7->fields,0);
                if (pvVar8->type == LIST) {
                  local_69 = 1;
                  local_f0 = local_f0 + 1;
                  local_15c = atoi((char *)local_20[local_f0]);
                  pcVar5 = (char *)local_20[local_f0];
                  pvVar7 = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::
                           operator[]((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                                       *)(in_RDI + 200),local_b8);
                  pvVar8 = std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::
                           operator[](&pvVar7->fields,0);
                  std::__cxx11::string::operator=((string *)&pvVar8->value,pcVar5);
                  local_c0 = (local_15c - 1) + local_c0;
                  for (local_26c = 0; local_26c < local_15c; local_26c = local_26c + 1) {
                    snprintf(local_268,0xff,"%03u",(ulong)local_26c);
                    pvVar7 = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                             ::operator[]((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                                           *)(in_RDI + 200),local_b8);
                    std::__cxx11::string::string(local_290,(string *)pvVar7);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_2b0,local_268,&local_2b1);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_2d8,"",&local_2d9);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_300,"",&local_301);
                    in_stack_fffffffffffff9c8 = &local_300;
                    in_stack_fffffffffffff9d0 = 0;
                    AddOptionField(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                                   in_stack_fffffffffffffad8,
                                   (TypeEnumType)((ulong)in_stack_fffffffffffffad0 >> 0x20),
                                   SUB81((ulong)in_stack_fffffffffffffad0 >> 0x18,0),
                                   in_stack_fffffffffffffac8,in_stack_fffffffffffffb00,
                                   (DataEnumType)in_stack_fffffffffffffb08);
                    std::__cxx11::string::~string((string *)&local_300);
                    std::allocator<char>::~allocator((allocator<char> *)&local_301);
                    std::__cxx11::string::~string(local_2d8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
                    std::__cxx11::string::~string(local_2b0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
                    std::__cxx11::string::~string(local_290);
                  }
                }
              }
            }
          }
          else if ((*(byte *)(in_RDI + 0xf8) & 1) != 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"The tag ");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            poVar4 = std::operator<<(poVar4,pcVar5);
            poVar4 = std::operator<<(poVar4," is not a valid argument : skipping this tag");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          }
          if ((local_69 & 1) != 0) {
            local_f0 = local_f0 + 1;
          }
        }
        else {
LAB_0012c407:
          if ((local_69 & 1) == 0) {
            local_310._M_current =
                 (Option *)
                 std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                           ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                            in_stack_fffffffffffff9c8);
            local_318 = 0;
            local_319 = 0;
            while( true ) {
              local_328 = (Option *)
                          std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::
                          end((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                              in_stack_fffffffffffff9c8);
              bVar2 = __gnu_cxx::operator!=
                                ((__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                                 (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                                  *)in_stack_fffffffffffff9c8);
              if (!bVar2) break;
              if (local_b0 <= (long)local_318) {
                __gnu_cxx::
                __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                ::operator*(&local_310);
                uVar11 = std::__cxx11::string::empty();
                if ((uVar11 & 1) != 0) {
                  local_b8 = local_318;
                  pOVar10 = __gnu_cxx::
                            __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                            ::operator*(&local_310);
                  local_c0 = std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::
                             size(&pOVar10->fields);
                  local_c0 = local_c0 & 0xffffffff;
                  local_319 = 1;
                  break;
                }
              }
              local_318 = local_318 + 1;
              __gnu_cxx::
              __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
              ::operator++(&local_310);
            }
            if (((local_319 & 1) == 0) && ((*(byte *)(in_RDI + 0xf8) & 1) != 0)) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "Too many arguments specified in your command line! ");
              poVar4 = std::operator<<(poVar4,"Skipping extra argument: ");
              poVar4 = std::operator<<(poVar4,(char *)local_20[local_f0]);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            }
            local_69 = 1;
            local_b0 = local_b8 + 1;
          }
        }
        sVar1 = local_b8;
        if ((local_c1 & 1) == 0) {
          if ((((local_69 & 1) != 0) && (local_f0 < local_14)) && (local_c0 != 0)) {
            if ((-1 < (long)local_b8) &&
               (sVar12 = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::
                         size((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                              (in_RDI + 200)), (long)sVar1 < (long)(int)sVar12)) {
              pvVar7 = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::
                       operator[]((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                                   *)(in_RDI + 200),local_b8);
              local_330 = std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::size
                                    (&pvVar7->fields);
              pcVar5 = (char *)local_20[local_f0];
              pvVar7 = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::
                       operator[]((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                                   *)(in_RDI + 200),local_b8);
              pvVar8 = std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::
                       operator[](&pvVar7->fields,local_330 - local_c0);
              std::__cxx11::string::operator=((string *)&pvVar8->value,pcVar5);
              pvVar7 = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::
                       operator[]((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                                   *)(in_RDI + 200),local_b8);
              pvVar8 = std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::
                       operator[](&pvVar7->fields,local_330 - local_c0);
              pvVar8->userDefined = true;
            }
            local_c0 = local_c0 - 1;
          }
        }
        else {
          uVar11 = std::__cxx11::string::empty();
          if ((uVar11 & 1) == 0) {
            std::__cxx11::string::operator+=(local_e8," ");
            std::__cxx11::string::operator+=(local_e8,(char *)local_20[local_f0]);
          }
          else {
            std::__cxx11::string::operator=(local_e8,(char *)local_20[local_f0]);
          }
        }
        if (local_c0 == 0) {
          local_69 = 0;
          pvVar7 = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::
                   operator[]((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                              (in_RDI + 200),local_b8);
          pvVar7->userDefined = true;
          std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::operator[]
                    ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                     (in_RDI + 200),local_b8);
          std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::push_back
                    ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                     in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
        }
      }
    }
    if (local_c0 == 0) {
      local_338._M_current =
           (Option *)
           std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                     ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                      in_stack_fffffffffffff9c8);
      local_339 = 0;
      while( true ) {
        local_348 = (Option *)
                    std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::end
                              ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                               in_stack_fffffffffffff9c8);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                            *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                           (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                            *)in_stack_fffffffffffff9c8);
        if (!bVar2) break;
        pOVar10 = __gnu_cxx::
                  __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                  ::operator*(&local_338);
        if ((pOVar10->required & 1U) == 0) {
LAB_0012cd87:
          __gnu_cxx::
          __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
          ::operator++(&local_338);
        }
        else {
          pOVar10 = __gnu_cxx::
                    __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                    ::operator*(&local_338);
          if ((pOVar10->userDefined & 1U) != 0) {
            __gnu_cxx::
            __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
            ::operator*(&local_338);
            local_358 = (Field *)std::
                                 vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::
                                 begin(in_stack_fffffffffffff9c8);
            __gnu_cxx::
            __normal_iterator<MetaCommand::Field_const*,std::vector<MetaCommand::Field,std::allocator<MetaCommand::Field>>>
            ::__normal_iterator<MetaCommand::Field*>
                      ((__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                        *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                       (__normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                        *)in_stack_fffffffffffff9c8);
            local_359 = 1;
            while( true ) {
              __gnu_cxx::
              __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
              ::operator*(&local_338);
              local_368 = (Field *)std::
                                   vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::
                                   end(in_stack_fffffffffffff9c8);
              bVar2 = __gnu_cxx::operator!=
                                ((__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                                 (__normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                                  *)in_stack_fffffffffffff9c8);
              if (!bVar2) break;
              __gnu_cxx::
              __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
              ::operator*(&local_350);
              uVar11 = std::__cxx11::string::empty();
              if ((uVar11 & 1) != 0) {
                local_359 = 0;
              }
              __gnu_cxx::
              __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
              ::operator++(&local_350);
            }
            if ((local_359 & 1) == 0) {
              __gnu_cxx::
              __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
              ::operator*(&local_338);
              uVar11 = std::__cxx11::string::empty();
              if ((uVar11 & 1) == 0) {
                poVar4 = std::operator<<((ostream *)&std::cout,"Field ");
                __gnu_cxx::
                __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                ::operator*(&local_338);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                poVar4 = std::operator<<(poVar4,pcVar5);
                poVar4 = std::operator<<(poVar4," is required but not defined");
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              }
              else {
                poVar4 = std::operator<<((ostream *)&std::cout,"Field ");
                __gnu_cxx::
                __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                ::operator*(&local_338);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                poVar4 = std::operator<<(poVar4,pcVar5);
                poVar4 = std::operator<<(poVar4," is required but not defined");
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              }
              local_339 = 1;
            }
            goto LAB_0012cd87;
          }
          poVar4 = std::operator<<((ostream *)&std::cout,"Option ");
          pOVar10 = __gnu_cxx::
                    __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                    ::operator*(&local_338);
          poVar4 = std::operator<<(poVar4,(string *)pOVar10);
          poVar4 = std::operator<<(poVar4," is required but not defined");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          local_339 = 1;
          __gnu_cxx::
          __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
          ::operator++(&local_338);
        }
      }
      if ((local_339 & 1) == 0) {
        local_370._M_current =
             (Option *)
             std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                       ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                        in_stack_fffffffffffff9c8);
        local_371 = 1;
        while( true ) {
          local_380 = (Option *)
                      std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::end
                                ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                                  *)in_stack_fffffffffffff9c8);
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                              *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                             (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                              *)in_stack_fffffffffffff9c8);
          if (!bVar2) break;
          __gnu_cxx::
          __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
          ::operator*(&local_370);
          std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::begin
                    (in_stack_fffffffffffff9c8);
          __gnu_cxx::
          __normal_iterator<MetaCommand::Field_const*,std::vector<MetaCommand::Field,std::allocator<MetaCommand::Field>>>
          ::__normal_iterator<MetaCommand::Field*>
                    ((__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                      *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                     (__normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                      *)in_stack_fffffffffffff9c8);
          while( true ) {
            __gnu_cxx::
            __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
            ::operator*(&local_370);
            std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::end
                      (in_stack_fffffffffffff9c8);
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                                *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                               (__normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                                *)in_stack_fffffffffffff9c8);
            if (!bVar2) break;
            pFVar13 = __gnu_cxx::
                      __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                      ::operator*(&local_388);
            if (((pFVar13->type == INT) ||
                (pFVar13 = __gnu_cxx::
                           __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                           ::operator*(&local_388), pFVar13->type == FLOAT)) ||
               (pFVar13 = __gnu_cxx::
                          __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                          ::operator*(&local_388), pFVar13->type == CHAR)) {
              __gnu_cxx::
              __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
              ::operator*(&local_388);
              uVar11 = std::__cxx11::string::empty();
              if ((uVar11 & 1) == 0) {
                __gnu_cxx::
                __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                ::operator*(&local_388);
                uVar11 = std::__cxx11::string::empty();
                if ((uVar11 & 1) == 0) {
                  __gnu_cxx::
                  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                  ::operator*(&local_388);
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  dVar14 = atof(pcVar5);
                  __gnu_cxx::
                  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                  ::operator*(&local_388);
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  dVar15 = atof(pcVar5);
                  if (dVar14 <= dVar15) goto LAB_0012d0fd;
LAB_0012d17c:
                  pOVar10 = __gnu_cxx::
                            __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                            ::operator*(&local_370);
                  poVar4 = std::operator<<((ostream *)&std::cout,(string *)pOVar10);
                  poVar4 = std::operator<<(poVar4,".");
                  pFVar13 = __gnu_cxx::
                            __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                            ::operator*(&local_388);
                  poVar4 = std::operator<<(poVar4,(string *)pFVar13);
                  poVar4 = std::operator<<(poVar4," : Value (");
                  pFVar13 = __gnu_cxx::
                            __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                            ::operator*(&local_388);
                  poVar4 = std::operator<<(poVar4,(string *)&pFVar13->value);
                  poVar4 = std::operator<<(poVar4,") ");
                  poVar4 = std::operator<<(poVar4,"is not in the range [");
                  pFVar13 = __gnu_cxx::
                            __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                            ::operator*(&local_388);
                  poVar4 = std::operator<<(poVar4,(string *)&pFVar13->rangeMin);
                  poVar4 = std::operator<<(poVar4,",");
                  pFVar13 = __gnu_cxx::
                            __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                            ::operator*(&local_388);
                  poVar4 = std::operator<<(poVar4,(string *)&pFVar13->rangeMax);
                  poVar4 = std::operator<<(poVar4,"]");
                  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                  local_371 = 0;
                }
                else {
LAB_0012d0fd:
                  __gnu_cxx::
                  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                  ::operator*(&local_388);
                  uVar11 = std::__cxx11::string::empty();
                  if ((uVar11 & 1) == 0) {
                    __gnu_cxx::
                    __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                    ::operator*(&local_388);
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    dVar14 = atof(pcVar5);
                    __gnu_cxx::
                    __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                    ::operator*(&local_388);
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    dVar15 = atof(pcVar5);
                    if (dVar14 < dVar15) goto LAB_0012d17c;
                  }
                }
              }
            }
            __gnu_cxx::
            __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
            ::operator++(&local_388);
          }
          __gnu_cxx::
          __normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
          ::operator++(&local_370);
        }
        if ((local_371 & 1) == 0) {
          local_1 = 0;
        }
        else if ((local_ea & 1) == 0) {
          local_1 = 1;
        }
        else {
          ExportGAD(in_stack_000000d8,in_stack_000000d7);
          local_1 = 0;
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"Command: ");
        poVar4 = std::operator<<(poVar4,(char *)*local_20);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,"Options: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,"  -v or -h for help listed in short format");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,"  -V or -H for help listed in long format");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,"  -vxml for help listed in xml format");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,"  -export-gad to export Grid Application");
        poVar4 = std::operator<<(poVar4,"Description file format");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"Not enough parameters for ");
      pvVar7 = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::operator[]
                         ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                          (in_RDI + 200),local_b8);
      poVar4 = std::operator<<(poVar4,(string *)pvVar7);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Command: ");
      poVar4 = std::operator<<(poVar4,(char *)*local_20);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Options: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"  -v or -h for help listed in short format");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"  -V or -H for help listed in long format");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"  -vxml for help listed in xml format");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"  -export-gad to export Grid Application");
      poVar4 = std::operator<<(poVar4,"Description file format");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_1 = 0;
    }
LAB_0012d368:
    local_f4 = 1;
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_90);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool MetaCommand::Parse(int argc, const char* argv[])
{
  m_ExecutableName = argv[0];

  size_t slash = m_ExecutableName.find_last_of("/");
  if(slash>0)
    {
    m_ExecutableName = m_ExecutableName.substr(slash+1,m_ExecutableName.size()-slash-1);
    }
  slash = m_ExecutableName.find_last_of("\\");
  if(slash>0)
    {
    m_ExecutableName = m_ExecutableName.substr(slash+1,m_ExecutableName.size()-slash-1);
    }

  // List the options if using -V
  if((argc == 2 && !strcmp(argv[1],"-V"))
     || (argc == 2 && !strcmp(argv[1],"-H")))
    {
    METAIO_STREAM::cout << "Usage : " << argv[0] << METAIO_STREAM::endl;
    this->ListOptions();
    return false;
    }
  // List the options if using -v
  else if((argc == 2 && !strcmp(argv[1],"-v"))
          || (argc == 2 && !strcmp(argv[1],"-h")))
    {
    METAIO_STREAM::cout << "Usage : " << argv[0] << METAIO_STREAM::endl;
    this->ListOptionsSimplified();
    return false;
    }
  else if(argc == 2 && !strcmp(argv[1],"-vxml"))
    {
    this->ListOptionsXML();
    return false;
    }
  else if(argc == 2 && !strcmp(argv[1],"-version"))
    {
    METAIO_STREAM::cout << "Version: " << m_Version.c_str() << METAIO_STREAM::endl;
    return false;
    }
  else if(argc == 2 && !strcmp(argv[1],"-date"))
    {
    METAIO_STREAM::cout << "Date: " << m_Date.c_str() << METAIO_STREAM::endl;
    return false;
    }
  else if(argc == 2 && !strcmp(argv[1],"-exportGAD"))
    {
    this->ExportGAD();
    return false;
    }

  // Fill in the results
  m_ParsedOptionVector.clear();
  bool inArgument = false;
  METAIO_STL::string tag = "";

  long currentField = 0; // current field position
  long currentOption = 0; // id of the option to fill
  size_t valuesRemaining=0;
  bool isComplete = false; // check if the option should be parse until the next tag is found
  METAIO_STL::string completeString = "";

  bool exportGAD = false;

  for(unsigned int i=1; i<(unsigned int)argc; ++i)
    {
    // If we have the tag -export-gad
    if(!strcmp(argv[i],"-exportGAD"))
      {
      exportGAD = true;
      continue;
      }

    // If this is a tag
    if(argv[i][0] == '-' && (atof(argv[i])==0) && (strlen(argv[i])>1))
      {
      // if we have a tag before the expected values we throw an exception
      if(valuesRemaining != 0)
        {
        if(!isComplete)
          {
          METAIO_STREAM::cout << "Found tag before end of value list!" << METAIO_STREAM::endl;
          return false;
          }
        else
          {
          m_OptionVector[currentOption].fields[0].value = completeString;
          m_OptionVector[currentOption].fields[0].userDefined = true;
          m_OptionVector[currentOption].userDefined = true;
          m_ParsedOptionVector.push_back(m_OptionVector[currentOption]);
          }
        }
      inArgument = false;
      // New tag so we add the previous values to the tag
      tag = argv[i];

      // Check if the tag is in the list
      if(this->OptionExistsByMinusTag(tag))
        {
        inArgument = true;
        valuesRemaining = this->GetOptionByMinusTag(tag)->fields.size();
        currentOption = this->GetOptionId(this->GetOptionByMinusTag(tag));

        if(currentOption < 0)
          {
          METAIO_STREAM::cout << "Error processing tag " << tag.c_str()
                    << ".  Tag exists but cannot find its Id."
                    << METAIO_STREAM::endl;
          }
        else
          {
          isComplete = m_OptionVector[currentOption].complete;

          if(m_OptionVector[currentOption].fields[0].type == FLAG)
            {
            // the tag exists by default
            m_OptionVector[currentOption].fields[0].value = "true";
            valuesRemaining = 0;
            inArgument = false;
            }
          else if(m_OptionVector[currentOption].fields[0].type == LIST)
            {
            inArgument = true;
            unsigned int valuesInList = (int)atoi(argv[++i]);
            m_OptionVector[currentOption].fields[0].value = argv[i];
            valuesRemaining += valuesInList-1;
            char optName[255];
            for(unsigned int j=0; j<valuesInList; j++)
              {
              snprintf(optName, sizeof(optName), "%03u", j);
              this->AddOptionField( m_OptionVector[currentOption].name,
                                    optName, STRING );
              }
            }
          }
        }
      else if(m_Verbose)
        {
        METAIO_STREAM::cout << "The tag " << tag.c_str()
                  << " is not a valid argument : skipping this tag"
                  << METAIO_STREAM::endl;
        }
      if(inArgument)
        {
        ++i;
        }
      }
    else if(!inArgument) // If this is a field
      {
      // Look for the field to add
      auto it = m_OptionVector.begin();
      long pos = 0;
      bool found = false;
      while(it != m_OptionVector.end())
        {
        if ((pos >= currentField) && ((*it).tag.empty())) {
          currentOption = pos;
          valuesRemaining = static_cast<unsigned int>((*it).fields.size());
          found = true;
          break;
        }
        ++pos;
        ++it;
        }

      if(!found && m_Verbose)
        {
        METAIO_STREAM::cout << "Too many arguments specified in your command line! "
                  << "Skipping extra argument: " << argv[i] << METAIO_STREAM::endl;
        }

      inArgument=true;
      currentField=currentOption+1;
      }

    // We collect the values
    if(isComplete)
      {
      if (completeString.empty()) {
        completeString = argv[i];
      } else {
        completeString += " ";
        completeString += argv[i];
      }
      }
    else if(inArgument && i<(unsigned int)argc && valuesRemaining>0)
      {
      if(currentOption >=0 && currentOption < (int)(m_OptionVector.size()))
        {
        auto s = static_cast<unsigned long>(
            m_OptionVector[currentOption].fields.size());
        m_OptionVector[currentOption].fields[s-valuesRemaining].value = argv[i];
        m_OptionVector[currentOption].fields[s-valuesRemaining].userDefined =
                                                                           true;
        }
      --valuesRemaining;
      }

    if(valuesRemaining == 0)
      {
      inArgument = false;
      m_OptionVector[currentOption].userDefined = true;
      m_ParsedOptionVector.push_back(m_OptionVector[currentOption]);
      }
    }

  if(valuesRemaining > 0)
    {
    METAIO_STREAM::cout << "Not enough parameters for "
              << m_OptionVector[currentOption].name << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "Command: " << argv[0] << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "Options: " << METAIO_STREAM::endl
              << "  -v or -h for help listed in short format" << METAIO_STREAM::endl
              << "  -V or -H for help listed in long format" << METAIO_STREAM::endl
              << "  -vxml for help listed in xml format" << METAIO_STREAM::endl
              << "  -export-gad to export Grid Application"
              << "Description file format" << METAIO_STREAM::endl;

    return false;
    }

  // Check if the options with required arguments are defined
    auto it = m_OptionVector.begin();
    bool requiredAndNotDefined = false;
    while (it != m_OptionVector.end()) {
      if ((*it).required) {
        // First check if the option is actually defined
        if (!(*it).userDefined) {
          METAIO_STREAM::cout << "Option " << (*it).name
                              << " is required but not defined"
                              << METAIO_STREAM::endl;
          requiredAndNotDefined = true;
          ++it;
          continue;
        }

      // Check if the values are defined
      METAIO_STL::vector<Field>::const_iterator itFields = (*it).fields.begin();
      bool defined = true;
      while(itFields != (*it).fields.end())
        {
        if ((*itFields).value.empty()) {
          defined = false;
        }
        ++itFields;
        }

      if(!defined)
        {
        if (!(*it).tag.empty()) {
          METAIO_STREAM::cout << "Field " << (*it).tag.c_str()
                    << " is required but not defined" << METAIO_STREAM::endl;
        } else {
          METAIO_STREAM::cout << "Field " << (*it).name.c_str()
                    << " is required but not defined" << METAIO_STREAM::endl;
        }
        requiredAndNotDefined = true;
        }
      }
    ++it;
    }

  if(requiredAndNotDefined)
    {
    METAIO_STREAM::cout << "Command: " << argv[0] << METAIO_STREAM::endl
              << "Options: " << METAIO_STREAM::endl
              << "  -v or -h for help listed in short format" << METAIO_STREAM::endl
              << "  -V or -H for help listed in long format" << METAIO_STREAM::endl
              << "  -vxml for help listed in xml format" << METAIO_STREAM::endl
              << "  -export-gad to export Grid Application"
              << "Description file format" << METAIO_STREAM::endl;
    return false;
    }

  // Check if the values are in range (if the range is defined)
    auto itParsed = m_ParsedOptionVector.begin();
    bool valueInRange = true;
    while (itParsed != m_ParsedOptionVector.end()) {
      METAIO_STL::vector<Field>::const_iterator itFields =
          (*itParsed).fields.begin();
      while (itFields != (*itParsed).fields.end()) {
        // Check only if this is a number
        if (((*itFields).type == INT || (*itFields).type == FLOAT ||
             (*itFields).type == CHAR) &&
            (!(*itFields).value.empty())) {
          // Check the range min
          if (((!(*itFields).rangeMin.empty()) &&
               (atof((*itFields).rangeMin.c_str()) >
                atof((*itFields).value.c_str()))) ||
              ((!(*itFields).rangeMax.empty()) &&
               (atof((*itFields).rangeMax.c_str()) <
                atof((*itFields).value.c_str())))) {
            METAIO_STREAM::cout
                << (*itParsed).name << "." << (*itFields).name << " : Value ("
                << (*itFields).value << ") "
                << "is not in the range [" << (*itFields).rangeMin << ","
                << (*itFields).rangeMax << "]" << METAIO_STREAM::endl;
            valueInRange = false;
          }
        }
        ++itFields;
      }
    ++itParsed;
    }

  if(!valueInRange)
    {
    return false;
    }

  // If everything is ok
  if(exportGAD)
    {
    this->ExportGAD(true);
    return false; // prevent from running the application
    }

  return true;
}